

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

string * __thiscall CESkyCoord::print_abi_cxx11_(CESkyCoord *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_148 [32];
  string local_128 [4];
  int in_stack_fffffffffffffedc;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [54];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"Coordinates:\n",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::__cxx11::to_string(in_stack_fffffffffffffedc);
  std::operator+((char *)__lhs,in_stack_fffffffffffffe90);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe90);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CEAngle::Deg((CEAngle *)(in_RSI + 8));
  std::__cxx11::to_string((double)__lhs);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  CEAngle::Deg((CEAngle *)(in_RSI + 0x18));
  std::__cxx11::to_string((double)__lhs);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::operator+=((string *)in_RDI,local_108);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  return __lhs;
}

Assistant:

std::string CESkyCoord::print(void) const
{
    std::string msg = "Coordinates:\n";
    msg += "   - System : " + std::to_string(int(coord_type_)) + "\n";
    msg += "   - X-coord: " + std::to_string(xcoord_.Deg()) + " deg\n";
    msg += "   - Y-coord: " + std::to_string(ycoord_.Deg()) + " deg\n";
    return msg;
}